

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationBuilder::findOrInsertNodeForCEs
          (CollationBuilder *this,int32_t strength,char **parserErrorReason,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int64_t local_38;
  int64_t ce;
  UErrorCode *errorCode_local;
  char **parserErrorReason_local;
  int32_t strength_local;
  CollationBuilder *this_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if (UVar1 == '\0') {
    while (this->cesLength != 0) {
      local_38 = this->ces[this->cesLength + -1];
      iVar2 = ceStrength(local_38);
      if (iVar2 <= strength) goto LAB_00294b1f;
      this->cesLength = this->cesLength + -1;
    }
    this->ces[0] = 0;
    local_38 = 0;
    this->cesLength = 1;
LAB_00294b1f:
    UVar1 = isTempCE(local_38);
    if (UVar1 == '\0') {
      if ((char)((ulong)local_38 >> 0x38) == -2) {
        *errorCode = U_UNSUPPORTED_ERROR;
        *parserErrorReason = "tailoring relative to an unassigned code point not supported";
        this_local._4_4_ = 0;
      }
      else {
        this_local._4_4_ = findOrInsertNodeForRootCE(this,local_38,strength,errorCode);
      }
    }
    else {
      this_local._4_4_ = indexFromTempCE(local_38);
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
CollationBuilder::findOrInsertNodeForCEs(int32_t strength, const char *&parserErrorReason,
                                         UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return 0; }
    U_ASSERT(UCOL_PRIMARY <= strength && strength <= UCOL_QUATERNARY);

    // Find the last CE that is at least as "strong" as the requested difference.
    // Note: Stronger is smaller (UCOL_PRIMARY=0).
    int64_t ce;
    for(;; --cesLength) {
        if(cesLength == 0) {
            ce = ces[0] = 0;
            cesLength = 1;
            break;
        } else {
            ce = ces[cesLength - 1];
        }
        if(ceStrength(ce) <= strength) { break; }
    }

    if(isTempCE(ce)) {
        // No need to findCommonNode() here for lower levels
        // because insertTailoredNodeAfter() will do that anyway.
        return indexFromTempCE(ce);
    }

    // root CE
    if((uint8_t)(ce >> 56) == Collation::UNASSIGNED_IMPLICIT_BYTE) {
        errorCode = U_UNSUPPORTED_ERROR;
        parserErrorReason = "tailoring relative to an unassigned code point not supported";
        return 0;
    }
    return findOrInsertNodeForRootCE(ce, strength, errorCode);
}